

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.cpp
# Opt level: O1

void xercesc_4_0::XMLString::trim(XMLCh *toTrim)

{
  short *psVar1;
  ulong uVar2;
  XMLCh XVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  
  uVar4 = 0;
  if (toTrim != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)toTrim + uVar4);
      uVar4 = uVar4 + 2;
    } while (*psVar1 != 0);
    uVar4 = ((long)uVar4 >> 1) - 1;
  }
  uVar5 = 0;
  uVar2 = uVar4;
  uVar7 = uVar4;
  uVar6 = uVar5;
  if (uVar4 != 0) {
    do {
      uVar6 = uVar5;
      if (-1 < (char)(&XMLChar1_0::fgCharCharsTable1_0)[(ushort)toTrim[uVar5]]) break;
      uVar5 = uVar5 + 1;
      uVar6 = uVar4;
    } while (uVar4 != uVar5);
  }
  while ((uVar6 < uVar2 &&
         (uVar7 = uVar2, (char)(&XMLChar1_0::fgCharCharsTable1_0)[(ushort)toTrim[uVar2 - 1]] < '\0')
         )) {
    uVar2 = uVar2 - 1;
    uVar7 = uVar6;
  }
  if (uVar7 != uVar4) {
    toTrim[uVar7] = L'\0';
  }
  if (uVar6 != 0) {
    XVar3 = toTrim[uVar6];
    if (XVar3 == L'\0') {
      lVar8 = 0;
    }
    else {
      lVar9 = 0;
      do {
        lVar8 = lVar9 + 1;
        toTrim[lVar9] = XVar3;
        XVar3 = toTrim[uVar6 + lVar9 + 1];
        lVar9 = lVar8;
      } while (XVar3 != L'\0');
    }
    toTrim[lVar8] = L'\0';
  }
  return;
}

Assistant:

void XMLString::trim(XMLCh* const toTrim)
{
    const XMLSize_t len = stringLen(toTrim);

    XMLSize_t skip, scrape;
    for (skip = 0; skip < len; skip++)
    {
        if (!XMLChar1_0::isWhitespace(toTrim[skip]))
            break;
    }

    for (scrape = len; scrape > skip; scrape--)
    {
        if (!XMLChar1_0::isWhitespace(toTrim[scrape - 1]))
            break;
    }

    // Cap off at the scrap point
    if (scrape != len)
        toTrim[scrape] = 0;

    if (skip)
    {
        // Copy the chars down
        XMLSize_t index = 0;
        while (toTrim[skip])
            toTrim[index++] = toTrim[skip++];

        toTrim[index] = 0;
    }
}